

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

iterator __thiscall CCoinsViewCache::FetchCoin(CCoinsViewCache *this,COutPoint *outpoint)

{
  long lVar1;
  bool bVar2;
  type *ptVar3;
  type_conflict *ptVar4;
  pointer ppVar5;
  ulong uVar6;
  size_t sVar7;
  CCoinsCacheEntry *in_RSI;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> in_RDI;
  long in_FS_OFFSET;
  type *inserted;
  type *ret;
  CoinsCachePair *in_stack_ffffffffffffff78;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *in_stack_ffffffffffffff80;
  CoinsCachePair *self;
  undefined8 *puVar8;
  uint8_t flags;
  key_type *in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::try_emplace<>((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                   *)in_RDI._M_cur,in_stack_ffffffffffffff90);
  ptVar3 = std::
           get<0ul,std::__detail::_Node_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>,false,false>,bool>
                     ((pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
                       *)in_stack_ffffffffffffff78);
  ptVar4 = std::
           get<1ul,std::__detail::_Node_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>,false,false>,bool>
                     ((pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
                       *)in_stack_ffffffffffffff78);
  if ((*ptVar4 & 1U) != 0) {
    puVar8 = *(undefined8 **)
              &((in_RDI._M_cur)->
               super__Hash_node_value<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>).
               super__Hash_node_value_base<std::pair<const_COutPoint,_CCoinsCacheEntry>_>._M_storage
               ._M_storage;
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
                         *)in_stack_ffffffffffffff78);
    uVar6 = (**(code **)*puVar8)(puVar8,in_RSI,&(ppVar5->second).coin);
    flags = (uint8_t)((ulong)puVar8 >> 0x38);
    if ((uVar6 & 1) == 0) {
      std::
      unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
      ::erase(in_stack_ffffffffffffff80,(iterator)in_RDI._M_cur);
      local_20._M_cur =
           (__node_type *)
           std::
           unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
           ::end(in_stack_ffffffffffffff80);
      goto LAB_0016e553;
    }
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_ffffffffffffff78);
    bVar2 = Coin::IsSpent((Coin *)in_stack_ffffffffffffff78);
    if (bVar2) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
                           *)in_stack_ffffffffffffff78);
      self = (CoinsCachePair *)&ppVar5->second;
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
      operator*((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                in_stack_ffffffffffffff78);
      CCoinsCacheEntry::AddFlags(in_RSI,flags,self,in_stack_ffffffffffffff78);
    }
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_ffffffffffffff78);
    sVar7 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff78);
    *(size_t *)
     ((long)&in_RDI._M_cur[3].
             super__Hash_node_value<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
             super__Hash_node_value_base<std::pair<const_COutPoint,_CCoinsCacheEntry>_>._M_storage.
             _M_storage + 0x50) =
         sVar7 + *(long *)((long)&in_RDI._M_cur[3].
                                  super__Hash_node_value<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                  .
                                  super__Hash_node_value_base<std::pair<const_COutPoint,_CCoinsCacheEntry>_>
                                  ._M_storage._M_storage + 0x50);
  }
  local_20._M_cur =
       (ptVar3->super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>).
       _M_cur;
LAB_0016e553:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (iterator)
         (_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>)local_20._M_cur;
}

Assistant:

CCoinsMap::iterator CCoinsViewCache::FetchCoin(const COutPoint &outpoint) const {
    const auto [ret, inserted] = cacheCoins.try_emplace(outpoint);
    if (inserted) {
        if (!base->GetCoin(outpoint, ret->second.coin)) {
            cacheCoins.erase(ret);
            return cacheCoins.end();
        }
        if (ret->second.coin.IsSpent()) {
            // The parent only has an empty entry for this outpoint; we can consider our version as fresh.
            ret->second.AddFlags(CCoinsCacheEntry::FRESH, *ret, m_sentinel);
        }
        cachedCoinsUsage += ret->second.coin.DynamicMemoryUsage();
    }
    return ret;
}